

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O3

void __thiscall ZlibWriter::~ZlibWriter(ZlibWriter *this)

{
  pointer puVar1;
  
  this->_vptr_ZlibWriter = (_func_int **)&PTR__ZlibWriter_00109d80;
  deflateEnd(&this->z);
  puVar1 = (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->zbuf).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

ZlibWriter::~ZlibWriter()
{
	deflateEnd(&z);
}